

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::Matrix::createIdentity(Matrix *this,int size)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double **extraout_RDX;
  double **ppdVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  Matrix MVar14;
  
  Matrix(this,size,size);
  auVar5 = _DAT_0012e6c0;
  auVar4 = _DAT_0012e6b0;
  iVar1 = this->rows_;
  ppdVar6 = extraout_RDX;
  if (0 < (long)iVar1) {
    uVar2 = this->cols_;
    ppdVar6 = this->p;
    lVar7 = (ulong)uVar2 - 1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_0012e6c0;
    do {
      if (0 < (int)uVar2) {
        pdVar3 = ppdVar6[uVar8];
        uVar9 = 0;
        auVar11 = auVar4;
        do {
          auVar12 = auVar11 ^ auVar5;
          if ((bool)(~(auVar10._4_4_ < auVar12._4_4_ ||
                      auVar10._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar10._4_4_) & 1)) {
            dVar13 = 1.0;
            if (uVar8 != uVar9) {
              dVar13 = 0.0;
            }
            pdVar3[uVar9] = dVar13;
          }
          if (auVar12._12_4_ <= auVar10._12_4_ &&
              (auVar12._8_4_ <= auVar10._8_4_ || auVar12._12_4_ != auVar10._12_4_)) {
            dVar13 = 1.0;
            if (uVar8 - 1 != uVar9) {
              dVar13 = 0.0;
            }
            pdVar3[uVar9 + 1] = dVar13;
          }
          uVar9 = uVar9 + 2;
          lVar7 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar7 + 2;
        } while ((uVar2 + 1 & 0xfffffffe) != uVar9);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (long)iVar1);
  }
  MVar14.p = ppdVar6;
  MVar14._0_8_ = this;
  return MVar14;
}

Assistant:

Matrix Matrix::createIdentity(int size)
{
    Matrix temp(size, size);
    for (int i = 0; i < temp.rows_; ++i) {
        for (int j = 0; j < temp.cols_; ++j) {
            if (i == j) {
                temp.p[i][j] = 1;
            } else {
                temp.p[i][j] = 0;
            }
        }
    }
    return temp;
}